

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BitvecTest(Bitvec *p,u32 i)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  if ((p != (Bitvec *)0x0) && (uVar2 = i - 1, uVar2 < p->iSize)) {
    do {
      uVar3 = p->iDivisor;
      if (uVar3 == 0) {
        if (p->iSize < 0xf81) {
          return (uint)(((p->u).aBitmap[uVar2 >> 3] >> (uVar2 & 7) & 1) != 0);
        }
        uVar4 = (ulong)uVar2 % 0x7c;
        while( true ) {
          iVar1 = *(int *)((long)&p->u + uVar4 * 4);
          if (iVar1 == 0) {
            return 0;
          }
          if (iVar1 == uVar2 + 1) break;
          uVar3 = (int)uVar4 + 1;
          if (uVar3 == 0x7c) {
            uVar3 = 0;
          }
          uVar4 = (ulong)uVar3;
        }
        return 1;
      }
      uVar4 = (ulong)uVar2;
      uVar2 = uVar2 % uVar3;
      p = *(Bitvec **)((long)&p->u + (uVar4 / uVar3) * 8);
    } while (p != (Bitvec *)0x0);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BitvecTest(Bitvec *p, u32 i){
  if( p==0 ) return 0;
  if( i>p->iSize || i==0 ) return 0;
  i--;
  while( p->iDivisor ){
    u32 bin = i/p->iDivisor;
    i = i%p->iDivisor;
    p = p->u.apSub[bin];
    if (!p) {
      return 0;
    }
  }
  if( p->iSize<=BITVEC_NBIT ){
    return (p->u.aBitmap[i/BITVEC_SZELEM] & (1<<(i&(BITVEC_SZELEM-1))))!=0;
  } else{
    u32 h = BITVEC_HASH(i++);
    while( p->u.aHash[h] ){
      if( p->u.aHash[h]==i ) return 1;
      h = (h+1) % BITVEC_NINT;
    }
    return 0;
  }
}